

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O3

void pybind11::detail::clear_instance(PyObject *self)

{
  ulong uVar1;
  PyTypeObject *t;
  void *valueptr;
  bool bVar2;
  _Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>
  _Var3;
  internals *piVar4;
  _Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false> __it;
  undefined8 *puVar5;
  byte bVar6;
  long lVar7;
  type_info *tinfo;
  long *plVar8;
  long lVar9;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  pVar10;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>_>
  pVar11;
  iterator __begin2;
  PyTypeObject *in_stack_ffffffffffffff98;
  PyObject *pPVar12;
  value_and_holder local_58;
  void *local_38;
  
  t = self->ob_type;
  pVar10 = all_type_info_get_cache(in_stack_ffffffffffffff98);
  _Var3 = pVar10.first.
          super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
          ._M_cur;
  if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    all_type_info_populate
              (t,(vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                  *)((long)_Var3.
                           super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                           ._M_cur + 0x10));
  }
  plVar8 = (long *)((long)_Var3.
                          super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                          ._M_cur + 0x10);
  if (*(undefined8 **)
       ((long)_Var3.
              super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
              ._M_cur + 0x10) ==
      *(undefined8 **)
       ((long)_Var3.
              super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
              ._M_cur + 0x18)) {
    tinfo = (type_info *)0x0;
  }
  else {
    tinfo = (type_info *)
            **(undefined8 **)
              ((long)_Var3.
                     super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                     ._M_cur + 0x10);
  }
  local_58.index = 0;
  local_58.vh = (void **)(self + 1);
  if ((self[3].ob_refcnt & 2) == 0) {
    local_58.vh = (void **)((PyObject *)local_58.vh)->ob_refcnt;
  }
  lVar9 = (long)*(undefined8 **)
                 ((long)_Var3.
                        super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                        ._M_cur + 0x18) - *plVar8;
  local_58.inst = (instance *)self;
  local_58.type = tinfo;
  if (lVar9 != 0) {
    pPVar12 = self;
    do {
      valueptr = (void *)*(Py_ssize_t *)local_58.vh;
      if (valueptr != (void *)0x0) {
        if (((local_58.inst)->field_0x30 & 2) == 0) {
          bVar6 = *(byte *)((long)((local_58.inst)->field_1).simple_value_holder[1] + local_58.index
                           ) & 2;
        }
        else {
          bVar6 = (byte)(local_58.inst)->field_0x30 >> 3 & 1;
        }
        local_58.type = tinfo;
        if (bVar6 != 0) {
          local_38 = valueptr;
          piVar4 = get_internals();
          pVar11 = std::
                   _Hashtable<const_void_*,_std::pair<const_void_*const,_pybind11::detail::instance_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                   ::equal_range(&(piVar4->registered_instances)._M_h,&local_38);
          __it._M_cur = (__node_type *)
                        pVar11.first.
                        super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                        ._M_cur;
          if ((_Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
               )__it._M_cur !=
              pVar11.second.
              super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
              ._M_cur.
              super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
             ) {
            do {
              if (self->ob_type == *(PyTypeObject **)(*(long *)((long)__it._M_cur + 0x10) + 8)) {
                std::
                _Hashtable<const_void_*,_std::pair<const_void_*const,_pybind11::detail::instance_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                ::erase(&(piVar4->registered_instances)._M_h,(const_iterator)__it._M_cur);
                bVar2 = true;
                goto LAB_00110d99;
              }
              __it._M_cur = *__it._M_cur;
            } while ((_Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                      )__it._M_cur !=
                     pVar11.second.
                     super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                     ._M_cur.
                     super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                    );
          }
          bVar2 = false;
LAB_00110d99:
          if ((tinfo->field_0x90 & 2) == 0) {
            traverse_offset_bases(valueptr,tinfo,(instance *)self,deregister_instance_impl);
          }
          if (!bVar2) {
            pybind11_fail("pybind11_object_dealloc(): Tried to deallocate unregistered instance!");
          }
        }
        if ((self[3].ob_refcnt & 1) == 0) {
          if (((local_58.inst)->field_0x30 & 2) == 0) {
            bVar6 = *(byte *)((long)((local_58.inst)->field_1).simple_value_holder[1] +
                             local_58.index);
          }
          else {
            bVar6 = (byte)(local_58.inst)->field_0x30 >> 2;
          }
          if ((bVar6 & 1) == 0) goto LAB_00110df3;
        }
        (*(local_58.type)->dealloc)(&local_58);
      }
LAB_00110df3:
      if ((pPVar12[3].ob_refcnt & 2) == 0) {
        lVar7 = *plVar8;
        local_58.vh = (PyTypeObject **)((long)local_58.vh + 8) +
                      *(long *)(*(long *)(lVar7 + local_58.index * 8) + 0x20);
      }
      else {
        lVar7 = *plVar8;
      }
      uVar1 = local_58.index + 1;
      if (uVar1 < (ulong)(*(long *)((long)_Var3.
                                          super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                          ._M_cur + 0x18) - lVar7 >> 3)) {
        tinfo = *(type_info **)(lVar7 + 8 + local_58.index * 8);
      }
      else {
        tinfo = (type_info *)0x0;
      }
      local_58.index = uVar1;
      local_58.type = tinfo;
    } while (uVar1 != lVar9 >> 3);
  }
  instance::deallocate_layout((instance *)self);
  if (self[2].ob_type != (PyTypeObject *)0x0) {
    PyObject_ClearWeakRefs(self);
  }
  puVar5 = (undefined8 *)_PyObject_GetDictPtr(self);
  if ((puVar5 != (undefined8 *)0x0) && (plVar8 = (long *)*puVar5, plVar8 != (long *)0x0)) {
    *puVar5 = 0;
    *plVar8 = *plVar8 + -1;
    if (*plVar8 == 0) {
      _Py_Dealloc();
    }
  }
  if ((self[3].ob_refcnt & 0x10) != 0) {
    clear_patients((PyObject *)0x110eaf);
  }
  return;
}

Assistant:

inline void clear_instance(PyObject *self) {
    auto instance = reinterpret_cast<detail::instance *>(self);

    // Deallocate any values/holders, if present:
    for (auto &v_h : values_and_holders(instance)) {
        if (v_h) {

            // We have to deregister before we call dealloc because, for virtual MI types, we still
            // need to be able to get the parent pointers.
            if (v_h.instance_registered() && !deregister_instance(instance, v_h.value_ptr(), v_h.type))
                pybind11_fail("pybind11_object_dealloc(): Tried to deallocate unregistered instance!");

            if (instance->owned || v_h.holder_constructed())
                v_h.type->dealloc(v_h);
        }
    }
    // Deallocate the value/holder layout internals:
    instance->deallocate_layout();

    if (instance->weakrefs)
        PyObject_ClearWeakRefs(self);

    PyObject **dict_ptr = _PyObject_GetDictPtr(self);
    if (dict_ptr)
        Py_CLEAR(*dict_ptr);

    if (instance->has_patients)
        clear_patients(self);
}